

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

int __thiscall
TRootHandler_MNDX::SearchMndxInfo
          (TRootHandler_MNDX *this,char *szFileName,DWORD dwPackage,PMNDX_ROOT_ENTRY *ppRootEntry)

{
  int iVar1;
  PMNDX_ROOT_ENTRY p_Var2;
  int iVar3;
  TMndxSearch Search;
  
  Search.pStruct40 = (TStruct40 *)0x0;
  Search.szSearchMask = (char *)0x0;
  Search.cchSearchMask = 0;
  Search.FileNameIndex = 0;
  Search.szFoundPath = (char *)0x0;
  Search.cchFoundPath = 0;
  iVar3 = 2;
  if ((this->MndxInfo).bRootFileLoaded == true) {
    Search.cchSearchMask = strlen(szFileName);
    Search.szSearchMask = szFileName;
    iVar1 = TMndxMarFile::SearchFile((this->MndxInfo).MarFiles[1],&Search);
    if ((iVar1 == 0) && (Search.FileNameIndex < (this->MndxInfo).MndxEntriesValid)) {
      for (p_Var2 = this->ppValidEntries[Search.FileNameIndex];
          (p_Var2->Flags & 0xffffff) != dwPackage; p_Var2 = p_Var2 + 1) {
        if ((int)p_Var2->Flags < 0) goto LAB_00118288;
      }
      iVar3 = 0;
      if (ppRootEntry != (PMNDX_ROOT_ENTRY *)0x0) {
        *ppRootEntry = p_Var2;
      }
    }
  }
LAB_00118288:
  TMndxSearch::FreeStruct40(&Search);
  return iVar3;
}

Assistant:

TMndxSearch()
    {
        szSearchMask = NULL;
        cchSearchMask = 0;
        szFoundPath = NULL;
        cchFoundPath = 0;
        FileNameIndex = 0;
        pStruct40 = NULL;
    }